

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::anon_unknown_8::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  pointer ppTVar1;
  TileBuffer *pTVar2;
  
  IlmThread_2_5::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__TileBufferTask_0037bb50;
  this->_ofd = ofd;
  ppTVar1 = (ofd->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_tileBuffer =
       ppTVar1[(ulong)(long)number %
               (ulong)((long)(ofd->tileBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)];
  IlmThread_2_5::Semaphore::wait();
  pTVar2 = this->_tileBuffer;
  *(int *)&pTVar2->_sem = dx;
  *(int *)&pTVar2->field_0x5c = dy;
  *(int *)&pTVar2->field_0x60 = lx;
  *(int *)&pTVar2->field_0x64 = ly;
  return;
}

Assistant:

TileBufferTask::TileBufferTask
    (TaskGroup *group,
     DeepTiledOutputFile::Data *ofd,
     int number,
     int dx, int dy,
     int lx, int ly)
:
    Task (group),
    _ofd (ofd),
    _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}